

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O1

void __thiscall xe::TestSet::removeGroup(TestSet *this,TestGroup *testGroup)

{
  _Rb_tree_header *p_Var1;
  TestGroup *group;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  pair<std::_Rb_tree_iterator<const_xe::TestNode_*>,_std::_Rb_tree_iterator<const_xe::TestNode_*>_>
  pVar4;
  TestGroup *local_18;
  
  p_Var1 = &(this->m_set)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->m_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var1->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0;
      p_Var3 = (&p_Var3->_M_left)[*(TestGroup **)(p_Var3 + 1) < testGroup]) {
    if (*(TestGroup **)(p_Var3 + 1) >= testGroup) {
      p_Var2 = p_Var3;
    }
  }
  p_Var3 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var1) &&
     (p_Var3 = p_Var2, testGroup < *(TestGroup **)(p_Var2 + 1))) {
    p_Var3 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    local_18 = testGroup;
    pVar4 = std::
            _Rb_tree<const_xe::TestNode_*,_const_xe::TestNode_*,_std::_Identity<const_xe::TestNode_*>,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
            ::equal_range((_Rb_tree<const_xe::TestNode_*,_const_xe::TestNode_*,_std::_Identity<const_xe::TestNode_*>,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                           *)this,(key_type *)&local_18);
    std::
    _Rb_tree<const_xe::TestNode_*,_const_xe::TestNode_*,_std::_Identity<const_xe::TestNode_*>,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
    ::_M_erase_aux((_Rb_tree<const_xe::TestNode_*,_const_xe::TestNode_*,_std::_Identity<const_xe::TestNode_*>,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                    *)this,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
    removeChildren(&this->m_set,testGroup);
    group = (testGroup->super_TestNode).m_parent;
    if (group != (TestGroup *)0x0) {
      removeEmptyGroups(&this->m_set,group);
    }
  }
  return;
}

Assistant:

void TestSet::removeGroup (const TestGroup* testGroup)
{
	if (m_set.find(testGroup) != m_set.end())
	{
		m_set.erase(testGroup);
		removeChildren(m_set, testGroup);
		if (testGroup->getParent() != DE_NULL)
			removeEmptyGroups(m_set, testGroup->getParent());
	}
}